

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O1

int __thiscall
boost::runtime::enum_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0>::
clone(enum_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0> *this,
     __fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 uVar1;
  enum_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0> *p;
  
  p = (enum_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0> *)
      operator_new(0x138);
  basic_param::basic_param((basic_param *)p,(basic_param *)__fn);
  (p->super_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0,_true>).
  super_basic_param._vptr_basic_param = (_func_int **)&PTR__parameter_001cc5b0;
  std::
  _Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_>
  ::_Rb_tree((_Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_>
              *)&(p->
                 super_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0,_true>
                 ).m_arg_factory,
             (_Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_>
              *)(__fn + 0xe8));
  uVar1 = *(undefined8 *)(__fn + 0x118);
  (p->super_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0,_true>).
  m_arg_factory.m_optional_value = (int)uVar1;
  (p->super_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0,_true>).
  m_arg_factory.m_default_value = (int)((ulong)uVar1 >> 0x20);
  (p->super_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0,_true>).
  super_basic_param._vptr_basic_param = (_func_int **)&PTR__enum_parameter_001cc528;
  std::
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ::vector(&p->m_valid_names,
           (vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
            *)(__fn + 0x120));
  shared_ptr<boost::runtime::basic_param>::
  shared_ptr<boost::runtime::enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0>>
            ((shared_ptr<boost::runtime::basic_param> *)this,p);
  return (int)this;
}

Assistant:

virtual basic_param_ptr clone() const
    {
        return basic_param_ptr( new enum_parameter( *this ) );
    }